

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O1

string * duckdb::Varint::InitializeVarintZero_abi_cxx11_(void)

{
  pointer pcVar1;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  ::std::__cxx11::string::_M_construct((ulong)in_RDI,'\x04');
  pcVar1 = (in_RDI->_M_dataplus)._M_p;
  pcVar1[0] = -0x80;
  pcVar1[1] = '\0';
  pcVar1[2] = '\x01';
  (in_RDI->_M_dataplus)._M_p[3] = '\0';
  return in_RDI;
}

Assistant:

string Varint::InitializeVarintZero() {
	uint32_t blob_size = 1 + VARINT_HEADER_SIZE;
	string result(blob_size, '0');
	SetHeader(&result[0], 1, false);
	result[3] = 0;
	return result;
}